

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_non_uniform.cpp
# Opt level: O0

spv_result_t spvtools::val::NonUniformPass(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  Op opcode_00;
  uint scope;
  spv_result_t sVar2;
  spv_result_t error;
  uint32_t execution_scope;
  Op opcode;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  opcode_00 = Instruction::opcode(inst);
  bVar1 = spvOpcodeIsNonUniformGroupOperation(opcode_00);
  if (((bVar1) && (opcode_00 != OpGroupNonUniformQuadAllKHR)) &&
     (opcode_00 != OpGroupNonUniformQuadAnyKHR)) {
    scope = Instruction::GetOperandAs<unsigned_int>(inst,2);
    sVar2 = ValidateExecutionScope(_,inst,scope);
    if (sVar2 != SPV_SUCCESS) {
      return sVar2;
    }
  }
  if (opcode_00 == OpGroupNonUniformElect) {
    __local._4_4_ = anon_unknown_2::ValidateGroupNonUniformElect(_,inst);
  }
  else if (opcode_00 - OpGroupNonUniformAll < 2) {
    __local._4_4_ = anon_unknown_2::ValidateGroupNonUniformAnyAll(_,inst);
  }
  else if (opcode_00 == OpGroupNonUniformAllEqual) {
    __local._4_4_ = anon_unknown_2::ValidateGroupNonUniformAllEqual(_,inst);
  }
  else {
    if (opcode_00 != OpGroupNonUniformBroadcast) {
      if (opcode_00 == OpGroupNonUniformBroadcastFirst) {
        sVar2 = anon_unknown_2::ValidateGroupNonUniformBroadcastFirst(_,inst);
        return sVar2;
      }
      if (opcode_00 == OpGroupNonUniformBallot) {
        sVar2 = anon_unknown_2::ValidateGroupNonUniformBallot(_,inst);
        return sVar2;
      }
      if (opcode_00 == OpGroupNonUniformInverseBallot) {
        sVar2 = anon_unknown_2::ValidateGroupNonUniformInverseBallot(_,inst);
        return sVar2;
      }
      if (opcode_00 == OpGroupNonUniformBallotBitExtract) {
        sVar2 = anon_unknown_2::ValidateGroupNonUniformBallotBitExtract(_,inst);
        return sVar2;
      }
      if (opcode_00 == OpGroupNonUniformBallotBitCount) {
        sVar2 = anon_unknown_2::ValidateGroupNonUniformBallotBitCount(_,inst);
        return sVar2;
      }
      if (opcode_00 - OpGroupNonUniformBallotFindLSB < 2) {
        sVar2 = anon_unknown_2::ValidateGroupNonUniformBallotFind(_,inst);
        return sVar2;
      }
      if (3 < opcode_00 - OpGroupNonUniformShuffle) {
        if (opcode_00 - OpGroupNonUniformIAdd < 0x10) {
          sVar2 = anon_unknown_2::ValidateGroupNonUniformArithmetic(_,inst);
          return sVar2;
        }
        if (1 < opcode_00 - OpGroupNonUniformQuadBroadcast) {
          if (opcode_00 != OpGroupNonUniformRotateKHR) {
            return SPV_SUCCESS;
          }
          sVar2 = anon_unknown_2::ValidateGroupNonUniformRotateKHR(_,inst);
          return sVar2;
        }
      }
    }
    __local._4_4_ = anon_unknown_2::ValidateGroupNonUniformBroadcastShuffle(_,inst);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t NonUniformPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();

  if (spvOpcodeIsNonUniformGroupOperation(opcode)) {
    // OpGroupNonUniformQuadAllKHR and OpGroupNonUniformQuadAnyKHR don't have
    // scope paramter
    if ((opcode != spv::Op::OpGroupNonUniformQuadAllKHR) &&
        (opcode != spv::Op::OpGroupNonUniformQuadAnyKHR)) {
      const uint32_t execution_scope = inst->GetOperandAs<uint32_t>(2);
      if (auto error = ValidateExecutionScope(_, inst, execution_scope)) {
        return error;
      }
    }
  }

  switch (opcode) {
    case spv::Op::OpGroupNonUniformElect:
      return ValidateGroupNonUniformElect(_, inst);
    case spv::Op::OpGroupNonUniformAny:
    case spv::Op::OpGroupNonUniformAll:
      return ValidateGroupNonUniformAnyAll(_, inst);
    case spv::Op::OpGroupNonUniformAllEqual:
      return ValidateGroupNonUniformAllEqual(_, inst);
    case spv::Op::OpGroupNonUniformBroadcast:
    case spv::Op::OpGroupNonUniformShuffle:
    case spv::Op::OpGroupNonUniformShuffleXor:
    case spv::Op::OpGroupNonUniformShuffleUp:
    case spv::Op::OpGroupNonUniformShuffleDown:
    case spv::Op::OpGroupNonUniformQuadBroadcast:
    case spv::Op::OpGroupNonUniformQuadSwap:
      return ValidateGroupNonUniformBroadcastShuffle(_, inst);
    case spv::Op::OpGroupNonUniformBroadcastFirst:
      return ValidateGroupNonUniformBroadcastFirst(_, inst);
    case spv::Op::OpGroupNonUniformBallot:
      return ValidateGroupNonUniformBallot(_, inst);
    case spv::Op::OpGroupNonUniformInverseBallot:
      return ValidateGroupNonUniformInverseBallot(_, inst);
    case spv::Op::OpGroupNonUniformBallotBitExtract:
      return ValidateGroupNonUniformBallotBitExtract(_, inst);
    case spv::Op::OpGroupNonUniformBallotBitCount:
      return ValidateGroupNonUniformBallotBitCount(_, inst);
    case spv::Op::OpGroupNonUniformBallotFindLSB:
    case spv::Op::OpGroupNonUniformBallotFindMSB:
      return ValidateGroupNonUniformBallotFind(_, inst);
    case spv::Op::OpGroupNonUniformIAdd:
    case spv::Op::OpGroupNonUniformFAdd:
    case spv::Op::OpGroupNonUniformIMul:
    case spv::Op::OpGroupNonUniformFMul:
    case spv::Op::OpGroupNonUniformSMin:
    case spv::Op::OpGroupNonUniformUMin:
    case spv::Op::OpGroupNonUniformFMin:
    case spv::Op::OpGroupNonUniformSMax:
    case spv::Op::OpGroupNonUniformUMax:
    case spv::Op::OpGroupNonUniformFMax:
    case spv::Op::OpGroupNonUniformBitwiseAnd:
    case spv::Op::OpGroupNonUniformBitwiseOr:
    case spv::Op::OpGroupNonUniformBitwiseXor:
    case spv::Op::OpGroupNonUniformLogicalAnd:
    case spv::Op::OpGroupNonUniformLogicalOr:
    case spv::Op::OpGroupNonUniformLogicalXor:
      return ValidateGroupNonUniformArithmetic(_, inst);
    case spv::Op::OpGroupNonUniformRotateKHR:
      return ValidateGroupNonUniformRotateKHR(_, inst);
    default:
      break;
  }

  return SPV_SUCCESS;
}